

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool __thiscall
cmFindPackageCommand::FindConfigFile(cmFindPackageCommand *this,string *dir,string *file)

{
  bool bVar1;
  size_type sVar2;
  string local_168;
  cmAlphaNum local_148;
  cmAlphaNum local_118;
  string local_e8;
  cmAlphaNum local_c8;
  cmAlphaNum local_98;
  string local_68;
  reference local_48;
  string *c;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string *file_local;
  string *dir_local;
  cmFindPackageCommand *this_local;
  
  sVar2 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&this->IgnoredPaths,dir);
  if (sVar2 == 0) {
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->Configs);
    c = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&this->Configs);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&c), bVar1) {
      local_48 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
      cmAlphaNum::cmAlphaNum(&local_98,dir);
      cmAlphaNum::cmAlphaNum(&local_c8,'/');
      cmStrCat<std::__cxx11::string>(&local_68,&local_98,&local_c8,local_48);
      std::__cxx11::string::operator=((string *)file,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      if (((this->super_cmFindCommon).DebugMode & 1U) != 0) {
        cmAlphaNum::cmAlphaNum(&local_118,&this->DebugBuffer);
        cmAlphaNum::cmAlphaNum(&local_148,"  ");
        cmStrCat<std::__cxx11::string,char[2]>
                  (&local_e8,&local_118,&local_148,file,(char (*) [2])0xc863b5);
        std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
      }
      bVar1 = cmsys::SystemTools::FileExists(file,true);
      if ((bVar1) && (bVar1 = CheckVersion(this,file), bVar1)) {
        if ((this->UseRealPath & 1U) != 0) {
          cmsys::SystemTools::GetRealPath(&local_168,file,(string *)0x0);
          std::__cxx11::string::operator=((string *)file,(string *)&local_168);
          std::__cxx11::string::~string((string *)&local_168);
        }
        return true;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
  }
  return false;
}

Assistant:

bool cmFindPackageCommand::FindConfigFile(std::string const& dir,
                                          std::string& file)
{
  if (this->IgnoredPaths.count(dir)) {
    return false;
  }

  for (std::string const& c : this->Configs) {
    file = cmStrCat(dir, '/', c);
    if (this->DebugMode) {
      this->DebugBuffer = cmStrCat(this->DebugBuffer, "  ", file, "\n");
    }
    if (cmSystemTools::FileExists(file, true) && this->CheckVersion(file)) {
      // Allow resolving symlinks when the config file is found through a link
      if (this->UseRealPath) {
        file = cmSystemTools::GetRealPath(file);
      }
      return true;
    }
  }
  return false;
}